

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_RegVm.cpp
# Opt level: O1

bool __thiscall ExecutorRegVm::Run(ExecutorRegVm *this,uint functionID,char *arguments)

{
  ExternFuncInfo *function;
  uint uVar1;
  Linker *pLVar2;
  uint *__dest;
  ExternFuncInfo *pEVar3;
  RegVmRegister *pRVar4;
  ulong uVar5;
  RegVmReturnType RVar6;
  int iVar7;
  size_t sVar8;
  uint uVar9;
  uint uVar10;
  RegVmCmd *instruction;
  char *pcVar11;
  uint uVar12;
  anon_union_8_3_3250f155_for_RegVmRegister_0 *regFilePtr;
  byte bVar13;
  bool bVar14;
  RegVmReturnType local_5c;
  anon_union_8_3_3250f155_for_RegVmRegister_0 *local_50;
  RegVmCmd *local_40;
  ulong local_38;
  
  if ((this->exLinker->exRegVmCode).count == 0) {
    this->codeRunning = false;
    this->callContinue = false;
    NULLC::SafeSprintf(this->execErrorBuffer,0x10000,"%s","ERROR: module contains no code");
    this->execErrorMessage = this->execErrorBuffer;
    (this->execErrorObject).typeID = 0;
    (this->execErrorObject).ptr = (char *)0x0;
    return false;
  }
  if ((functionID == 0xffffffff) || (this->codeRunning == false)) {
    InitExecution(this);
  }
  this->codeRunning = true;
  pLVar2 = this->exLinker;
  if ((pLVar2->exRegVmCode).count == 0) {
LAB_0014183b:
    pcVar11 = 
    "T &FastVector<RegVmCmd>::operator[](unsigned int) [T = RegVmCmd, zeroNewMemory = false, skipConstructor = false]"
    ;
    goto LAB_001418d6;
  }
  instruction = (pLVar2->exRegVmCode).data;
  this->codeBase = instruction;
  uVar1 = this->lastFinalReturn;
  uVar10 = (this->dataStack).count;
  local_38 = (ulong)uVar10;
  this->lastFinalReturn = (this->callStack).count;
  regFilePtr = &this->regFileLastTop->field_0;
  local_50 = regFilePtr + 0x100;
  if (functionID == 0xffffffff) {
    if (uVar10 < pLVar2->globalVarSize) {
      __assert_fail("dataStack.size() >= exLinker->globalVarSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_RegVm.cpp"
                    ,0x115,"bool ExecutorRegVm::Run(unsigned int, const char *)");
    }
    bVar13 = 0;
    memset((this->dataStack).data,0,(ulong)pLVar2->globalVarSize);
    *regFilePtr = (anon_union_8_3_3250f155_for_RegVmRegister_0)(this->dataStack).data;
    regFilePtr[1] = (anon_union_8_3_3250f155_for_RegVmRegister_0)(this->dataStack).data;
    regFilePtr[2] =
         (anon_union_8_3_3250f155_for_RegVmRegister_0)(this->exLinker->exRegVmConstants).data;
    regFilePtr[3].longValue = (int64_t)regFilePtr;
    memset(regFilePtr + 4,0,0x7e0);
    local_5c = rvrVoid;
LAB_00141654:
    pRVar4 = this->regFileLastTop;
    this->regFileLastTop = (RegVmRegister *)local_50;
    RVar6 = local_5c;
    if (instruction != (RegVmCmd *)0x0) {
      RVar6 = RunCode(instruction,(RegVmRegister *)regFilePtr,this,this->codeBase);
    }
    this->regFileLastTop = pRVar4;
    if ((this->dataStack).count < (uint)local_38) {
      __assert_fail("newSize <= count",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x8e,
                    "void FastVector<char, true, true>::shrink(unsigned int) [T = char, zeroNewMemory = true, skipConstructor = true]"
                   );
    }
    (this->dataStack).count = (uint)local_38;
    if (RVar6 == rvrError) {
      bVar13 = 1;
      RVar6 = local_5c;
    }
    else if ((local_5c != rvrVoid) && (bVar14 = local_5c != RVar6, RVar6 = local_5c, bVar14)) {
      __assert_fail("retType == resultType && \"expected different result\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_RegVm.cpp"
                    ,0x136,"bool ExecutorRegVm::Run(unsigned int, const char *)");
    }
    if (bVar13 != 0) {
      if (this->lastFinalReturn == 0) {
        pcVar11 = this->execErrorBuffer;
        sVar8 = strlen(pcVar11);
        pcVar11 = pcVar11 + sVar8;
        uVar10 = 0;
        iVar7 = NULLC::SafeSprintf(pcVar11,(long)(0x10000 - (int)sVar8),"\r\nCall stack:\r\n");
        pcVar11 = pcVar11 + iVar7;
        do {
          uVar12 = GetCallStackAddress(this,uVar10);
          if (uVar12 != 0) {
            uVar9 = PrintStackFrame(uVar12,pcVar11,
                                    (*(int *)&this->execErrorBuffer - (int)pcVar11) + 0x10000,false)
            ;
            pcVar11 = pcVar11 + uVar9;
          }
          uVar10 = uVar10 + 1;
        } while (uVar12 != 0);
      }
      this->execErrorFinalReturnDepth = this->lastFinalReturn;
      this->lastFinalReturn = uVar1;
      this->callContinue = false;
      this->codeRunning = false;
LAB_001417e8:
      return (bool)(bVar13 ^ 1);
    }
    this->lastFinalReturn = uVar1;
    if (functionID == 0xffffffff) {
      this->tempStackType = 0;
      if (RVar6 == rvrDouble) {
        this->tempStackType = 7;
      }
      else if (RVar6 == rvrLong) {
        this->tempStackType = 5;
      }
      else if (RVar6 == rvrInt) {
        this->tempStackType = 4;
      }
      goto LAB_001417e8;
    }
    if (functionID < this->exFunctions->count) {
      uVar1 = this->exFunctions->data[functionID].funcType;
      if (uVar1 < this->exTypes->count) {
        uVar1 = this->exTypes->data[uVar1].field_11.subType;
        if (uVar1 < (this->exLinker->exTypeExtra).count) {
          this->tempStackType = (this->exLinker->exTypeExtra).data[uVar1].type;
          goto LAB_001417e8;
        }
        pcVar11 = 
        "T &FastVector<ExternMemberInfo>::operator[](unsigned int) [T = ExternMemberInfo, zeroNewMemory = false, skipConstructor = false]"
        ;
      }
      else {
        pcVar11 = 
        "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
        ;
      }
      goto LAB_001418d6;
    }
  }
  else if (functionID < this->exFunctions->count) {
    __dest = this->tempStackArrayBase;
    pEVar3 = this->exFunctions->data;
    function = pEVar3 + functionID;
    uVar10 = pEVar3[functionID].regVmAddress;
    local_5c = GetFunctionVmReturnType(function,this->exTypes->data,(pLVar2->exTypeExtra).data);
    if ((ulong)uVar10 == 0xffffffff) {
      memcpy(__dest,arguments,(ulong)function->argumentSize);
      if (function->funcPtrWrap == (_func_void_void_ptr_char_ptr_char_ptr *)0x0) {
        instruction = (RegVmCmd *)0x0;
        this->codeRunning = false;
        this->callContinue = false;
        NULLC::SafeSprintf(this->execErrorBuffer,0x10000,"%s",
                           "ERROR: external raw function calls are disabled");
        this->execErrorMessage = this->execErrorBuffer;
        (this->execErrorObject).typeID = 0;
        (this->execErrorObject).ptr = (char *)0x0;
        bVar13 = 1;
      }
      else {
        (*function->funcPtrWrap)(function->funcPtrWrapTarget,(char *)__dest,(char *)__dest);
        bVar13 = this->callContinue ^ 1;
        instruction = (RegVmCmd *)0x0;
      }
    }
    else {
      if ((this->exLinker->exRegVmCode).count <= uVar10) goto LAB_0014183b;
      instruction = (this->exLinker->exRegVmCode).data + uVar10;
      uVar10 = function->argumentSize;
      uVar12 = (this->dataStack).count;
      uVar9 = 0x10 - (uVar12 & 0xf);
      if ((uVar12 & 0xf) == 0) {
        uVar9 = 0;
      }
      if (uVar12 + uVar9 + uVar10 < (this->dataStack).max) {
        memcpy((this->dataStack).data + (ulong)uVar9 + (ulong)uVar12,arguments,(ulong)uVar10);
        uVar12 = (this->dataStack).count;
        if ((uVar12 & 0xf) != 0) {
          __assert_fail("dataStack.size() % 16 == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_RegVm.cpp"
                        ,0xf6,"bool ExecutorRegVm::Run(unsigned int, const char *)");
        }
        uVar9 = function->stackSize + 0xf & 0xfffffff0;
        regFilePtr = &this->regFileLastTop->field_0;
        iVar7 = function->regVmRegisters;
        uVar12 = uVar12 + uVar9;
        if (uVar12 < (this->dataStack).max) {
          if ((this->dataStack).max <= uVar12) {
            FastVector<char,_true,_true>::grow(&this->dataStack,uVar12);
          }
          uVar5 = local_38;
          (this->dataStack).count = uVar12;
          if (uVar9 < uVar10) {
            __assert_fail("argumentsSize <= stackSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_RegVm.cpp"
                          ,0x103,"bool ExecutorRegVm::Run(unsigned int, const char *)");
          }
          if (uVar9 != uVar10) {
            memset((this->dataStack).data + uVar10 + local_38,0,(ulong)(uVar9 - uVar10));
          }
          *regFilePtr = (anon_union_8_3_3250f155_for_RegVmRegister_0)(this->dataStack).data;
          regFilePtr[1].longValue = (int64_t)((this->dataStack).data + uVar5);
          regFilePtr[2] =
               (anon_union_8_3_3250f155_for_RegVmRegister_0)(this->exLinker->exRegVmConstants).data;
          regFilePtr[3].longValue = (int64_t)regFilePtr;
        }
        else {
          local_40 = instruction + 1;
          uVar10 = (this->callStack).count;
          if (uVar10 == (this->callStack).max) {
            FastVector<RegVmCmd_*,_false,_false>::grow_and_add(&this->callStack,uVar10,&local_40);
          }
          else {
            (this->callStack).count = uVar10 + 1;
            (this->callStack).data[uVar10] = local_40;
          }
          instruction = (RegVmCmd *)0x0;
          this->codeRunning = false;
          this->callContinue = false;
          NULLC::SafeSprintf(this->execErrorBuffer,0x10000,"%s","ERROR: stack overflow");
          this->execErrorMessage = this->execErrorBuffer;
          (this->execErrorObject).typeID = 0;
          (this->execErrorObject).ptr = (char *)0x0;
          local_5c = rvrError;
        }
        local_50 = regFilePtr + iVar7;
        bVar13 = 0;
        memset(regFilePtr + 4,0,(long)iVar7 * 8 - 0x20);
      }
      else {
        local_40 = instruction + 1;
        uVar10 = (this->callStack).count;
        if (uVar10 == (this->callStack).max) {
          FastVector<RegVmCmd_*,_false,_false>::grow_and_add(&this->callStack,uVar10,&local_40);
        }
        else {
          (this->callStack).count = uVar10 + 1;
          (this->callStack).data[uVar10] = local_40;
        }
        bVar13 = 0;
        this->codeRunning = false;
        this->callContinue = false;
        NULLC::SafeSprintf(this->execErrorBuffer,0x10000,"%s","ERROR: stack overflow");
        this->execErrorMessage = this->execErrorBuffer;
        (this->execErrorObject).typeID = 0;
        (this->execErrorObject).ptr = (char *)0x0;
        local_5c = rvrError;
        instruction = (RegVmCmd *)0x0;
      }
    }
    goto LAB_00141654;
  }
  pcVar11 = 
  "T &FastVector<ExternFuncInfo>::operator[](unsigned int) [T = ExternFuncInfo, zeroNewMemory = false, skipConstructor = false]"
  ;
LAB_001418d6:
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x7f,pcVar11);
}

Assistant:

bool ExecutorRegVm::Run(unsigned functionID, const char *arguments)
{
	if(exLinker->exRegVmCode.empty())
	{
		Stop("ERROR: module contains no code");
		return false;
	}

	if(!codeRunning || functionID == ~0u)
		InitExecution();

	codeRunning = true;

	RegVmReturnType retType = rvrVoid;

	codeBase = &exLinker->exRegVmCode[0];
	RegVmCmd *instruction = &exLinker->exRegVmCode[0];

	bool errorState = false;

	// We will know that return is global if call stack size is equal to current
	unsigned prevLastFinalReturn = lastFinalReturn;
	lastFinalReturn = callStack.size();

	unsigned prevDataSize = dataStack.size();

	RegVmRegister *regFilePtr = regFileLastTop;
	RegVmRegister *regFileTop = regFilePtr + 256;

	unsigned *tempStackPtr = tempStackArrayBase;

	if(functionID != ~0u)
	{
		ExternFuncInfo &target = exFunctions[functionID];

		unsigned funcPos = ~0u;
		funcPos = target.regVmAddress;

		retType = (RegVmReturnType)GetFunctionVmReturnType(target, exTypes.data, exLinker->exTypeExtra.data);

		if(funcPos == ~0u)
		{
			// Copy all arguments
			memcpy(tempStackPtr, arguments, target.argumentSize);

			// Call function
			if(target.funcPtrWrap)
			{
				target.funcPtrWrap(target.funcPtrWrapTarget, (char*)tempStackPtr, (char*)tempStackPtr);

				if(!callContinue)
					errorState = true;
			}
			else
			{
				if(!RunExternalFunction(functionID, tempStackPtr))
					errorState = true;
			}

			// This will disable NULLC code execution while leaving error check and result retrieval
			instruction = NULL;
		}
		else
		{
			instruction = &exLinker->exRegVmCode[funcPos];

			unsigned argumentsSize = target.argumentSize;

			// Keep stack frames aligned to 16 byte boundary
			unsigned alignOffset = (dataStack.size() % 16 != 0) ? (16 - (dataStack.size() % 16)) : 0;

			if(dataStack.size() + alignOffset + argumentsSize >= dataStack.max)
			{
				callStack.push_back(instruction + 1);
				instruction = NULL;
				Stop("ERROR: stack overflow");
				retType = rvrError;
			}
			else
			{
				// Copy arguments to new stack frame
				memcpy((char*)(dataStack.data + dataStack.size() + alignOffset), arguments, argumentsSize);

				unsigned stackSize = (target.stackSize + 0xf) & ~0xf;

				regFilePtr = regFileLastTop;
				regFileTop = regFilePtr + target.regVmRegisters;

				assert(dataStack.size() % 16 == 0);

				if(dataStack.size() + stackSize >= dataStack.max)
				{
					callStack.push_back(instruction + 1);
					instruction = NULL;
					Stop("ERROR: stack overflow");
					retType = rvrError;
				}
				else
				{
					dataStack.resize(dataStack.size() + stackSize);

					assert(argumentsSize <= stackSize);

					if(stackSize - argumentsSize)
						memset(dataStack.data + prevDataSize + argumentsSize, 0, stackSize - argumentsSize);

					regFilePtr[rvrrGlobals].ptrValue = uintptr_t(dataStack.data);
					regFilePtr[rvrrFrame].ptrValue = uintptr_t(dataStack.data + prevDataSize);
					regFilePtr[rvrrConstants].ptrValue = uintptr_t(exLinker->exRegVmConstants.data);
					regFilePtr[rvrrRegisters].ptrValue = uintptr_t(regFilePtr);
				}

				memset(regFilePtr + rvrrCount, 0, (regFileTop - regFilePtr - rvrrCount) * sizeof(regFilePtr[0]));
			}
		}
	}
	else
	{
		// If global code is executed, reset all global variables
		assert(dataStack.size() >= exLinker->globalVarSize);
		memset(dataStack.data, 0, exLinker->globalVarSize);

		regFilePtr[rvrrGlobals].ptrValue = uintptr_t(dataStack.data);
		regFilePtr[rvrrFrame].ptrValue = uintptr_t(dataStack.data);
		regFilePtr[rvrrConstants].ptrValue = uintptr_t(exLinker->exRegVmConstants.data);
		regFilePtr[rvrrRegisters].ptrValue = uintptr_t(regFilePtr);

		memset(regFilePtr + rvrrCount, 0, (regFileTop - regFilePtr - rvrrCount) * sizeof(regFilePtr[0]));
	}

	RegVmRegister *prevRegFileLastTop = regFileLastTop;

	regFileLastTop = regFileTop;

	RegVmReturnType resultType = retType;

	if(instruction)
		resultType = RunCode(instruction, regFilePtr, this, codeBase);

	regFileLastTop = prevRegFileLastTop;

	dataStack.shrink(prevDataSize);

	if(resultType == rvrError)
	{
		errorState = true;
	}
	else
	{
		if(retType == rvrVoid)
			retType = resultType;
		else
			assert(retType == resultType && "expected different result");
	}

	// If there was an execution error
	if(errorState)
	{
		// Print call stack on error, when we get to the first function
		if(lastFinalReturn == 0)
		{
			char *currPos = execErrorBuffer + strlen(execErrorBuffer);
			currPos += NULLC::SafeSprintf(currPos, NULLC_ERROR_BUFFER_SIZE - int(currPos - execErrorBuffer), "\r\nCall stack:\r\n");

			unsigned currentFrame = 0;
			while(unsigned address = GetCallStackAddress(currentFrame++))
				currPos += PrintStackFrame(address, currPos, NULLC_ERROR_BUFFER_SIZE - int(currPos - execErrorBuffer), false);
		}

		execErrorFinalReturnDepth = lastFinalReturn;
		lastFinalReturn = prevLastFinalReturn;

		// Ascertain that execution stops when there is a chain of nullcRunFunction
		callContinue = false;
		codeRunning = false;

		return false;
	}

	lastFinalReturn = prevLastFinalReturn;

	if(functionID != ~0u)
	{
		ExternFuncInfo &target = exFunctions[functionID];
		ExternTypeInfo &targetType = exTypes[target.funcType];

		tempStackType = exLinker->exTypeExtra[targetType.memberOffset].type;
	}
	else
	{
		tempStackType = NULLC_TYPE_VOID;

		switch(retType)
		{
		case rvrInt:
			tempStackType = NULLC_TYPE_INT;
			break;
		case rvrDouble:
			tempStackType = NULLC_TYPE_DOUBLE;
			break;
		case rvrLong:
			tempStackType = NULLC_TYPE_LONG;
			break;
		default:
			break;
		}
	}

	return true;
}